

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void fe_tobytes(uint8_t *s,fe *f)

{
  int iVar1;
  uint local_1c;
  uint _assert_fe_i;
  fe *f_local;
  uint8_t *s_local;
  
  local_1c = 0;
  while( true ) {
    if (4 < local_1c) {
      fiat_25519_to_bytes(s,f->v);
      return;
    }
    iVar1 = constant_time_declassify_int((uint)(f->v[local_1c] < 0x8cccccccccccd));
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                ,0xa6,"void fe_tobytes(uint8_t *, const fe *)");
}

Assistant:

static void fe_tobytes(uint8_t s[32], const fe *f) {
  assert_fe(f->v);
  fiat_25519_to_bytes(s, f->v);
}